

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vminit.cpp
# Opt level: O3

void vm_terminate(vm_globals *vmg__,CVmMainClientIfc *clientifc)

{
  uint *puVar1;
  CVmMemory *pCVar2;
  CVmUndo *pCVar3;
  CVmMetaTable *pCVar4;
  CVmBifTable *pCVar5;
  CVmSrcfTable *pCVar6;
  CVmBifTADSGlobals *pCVar7;
  CCharmapToUni *pCVar8;
  CCharmapToLocal *pCVar9;
  CVmDynamicCompiler *pCVar10;
  CVmTimeZoneCache *pCVar11;
  
  vm_terminate_debug_shutdown();
  CVmUndo::drop_undo(G_undo_X);
  (*clientifc->_vptr_CVmMainClientIfc[4])(clientifc,0,G_console_X);
  pCVar8 = G_cmap_from_fname_X;
  puVar1 = &(G_cmap_from_fname_X->super_CCharmap).ref_cnt_;
  *puVar1 = *puVar1 - 1;
  if (*puVar1 == 0) {
    (*(pCVar8->super_CCharmap)._vptr_CCharmap[1])();
  }
  pCVar9 = G_cmap_to_fname_X;
  puVar1 = &(G_cmap_to_fname_X->super_CCharmap).ref_cnt_;
  *puVar1 = *puVar1 - 1;
  if (*puVar1 == 0) {
    (*(pCVar9->super_CCharmap)._vptr_CCharmap[1])();
  }
  pCVar8 = G_cmap_from_ui_X;
  puVar1 = &(G_cmap_from_ui_X->super_CCharmap).ref_cnt_;
  *puVar1 = *puVar1 - 1;
  if (*puVar1 == 0) {
    (*(pCVar8->super_CCharmap)._vptr_CCharmap[1])();
  }
  pCVar9 = G_cmap_to_ui_X;
  puVar1 = &(G_cmap_to_ui_X->super_CCharmap).ref_cnt_;
  *puVar1 = *puVar1 - 1;
  if (*puVar1 == 0) {
    (*(pCVar9->super_CCharmap)._vptr_CCharmap[1])();
  }
  pCVar8 = G_cmap_from_file_X;
  puVar1 = &(G_cmap_from_file_X->super_CCharmap).ref_cnt_;
  *puVar1 = *puVar1 - 1;
  if (*puVar1 == 0) {
    (*(pCVar8->super_CCharmap)._vptr_CCharmap[1])();
  }
  pCVar9 = G_cmap_to_file_X;
  puVar1 = &(G_cmap_to_file_X->super_CCharmap).ref_cnt_;
  *puVar1 = *puVar1 - 1;
  if (*puVar1 == 0) {
    (*(pCVar9->super_CCharmap)._vptr_CCharmap[1])();
  }
  pCVar9 = G_cmap_to_log_X;
  puVar1 = &(G_cmap_to_log_X->super_CCharmap).ref_cnt_;
  *puVar1 = *puVar1 - 1;
  if (*puVar1 == 0) {
    (*(pCVar9->super_CCharmap)._vptr_CCharmap[1])();
  }
  lib_free_str(G_disp_cset_name_X);
  CVmObjBigNum::term_cache();
  pCVar7 = G_bif_tads_globals_X;
  if (G_bif_tads_globals_X != (CVmBifTADSGlobals *)0x0) {
    CVmBifTADSGlobals::~CVmBifTADSGlobals(G_bif_tads_globals_X);
  }
  operator_delete(pCVar7,0x30);
  CVmRun::terminate(&G_interpreter_X);
  CVmObjTads::class_term();
  pCVar6 = G_srcf_table_X;
  if (G_srcf_table_X != (CVmSrcfTable *)0x0) {
    CVmSrcfTable::~CVmSrcfTable(G_srcf_table_X);
  }
  operator_delete(pCVar6,0x18);
  vm_terminate_debug_delete();
  pCVar10 = G_dyncomp_X;
  if (G_dyncomp_X != (CVmDynamicCompiler *)0x0) {
    CVmDynamicCompiler::~CVmDynamicCompiler(G_dyncomp_X);
    operator_delete(pCVar10,0x10);
    G_dyncomp_X = (CVmDynamicCompiler *)0x0;
  }
  (**(code **)(G_code_pool_X.super_CVmPoolPaged._0_8_ + 0x20))();
  (**(code **)(G_const_pool_X.super_CVmPoolPaged._0_8_ + 0x20))();
  CVmObjTable::clear_obj_table(&G_obj_table_X);
  CVmBifTable::clear(G_bif_table_X);
  pCVar4 = G_meta_table_X;
  if (G_meta_table_X != (CVmMetaTable *)0x0) {
    CVmMetaTable::~CVmMetaTable(G_meta_table_X);
  }
  operator_delete(pCVar4,0x20);
  pCVar5 = G_bif_table_X;
  if (G_bif_table_X != (CVmBifTable *)0x0) {
    CVmBifTable::~CVmBifTable(G_bif_table_X);
  }
  operator_delete(pCVar5,0x20);
  pCVar3 = G_undo_X;
  if (G_undo_X != (CVmUndo *)0x0) {
    CVmUndo::~CVmUndo(G_undo_X);
  }
  operator_delete(pCVar3,0x38);
  CVmObjTable::delete_obj_table(&G_obj_table_X);
  pCVar2 = G_mem_X;
  if (G_mem_X != (CVmMemory *)0x0) {
    (*G_mem_X->varheap_->_vptr_CVmVarHeap[3])();
  }
  operator_delete(pCVar2,0x10);
  if (G_varheap_X != (CVmVarHeap *)0x0) {
    (*G_varheap_X->_vptr_CVmVarHeap[1])();
  }
  pCVar11 = G_tzcache_X;
  if (G_tzcache_X != (CVmTimeZoneCache *)0x0) {
    CVmTimeZoneCache::~CVmTimeZoneCache(G_tzcache_X);
  }
  operator_delete(pCVar11,0x50);
  err_terminate();
  return;
}

Assistant:

void vm_terminate(vm_globals *vmg__, CVmMainClientIfc *clientifc)
{
    /* tell the debugger to shut down, if necessary */
    vm_terminate_debug_shutdown(vmg0_);
    
    /* drop all undo information */
    G_undo->drop_undo(vmg0_);

    /* delete the main console */
    clientifc->delete_console(VMGLOB_ADDR, G_console);

    /* release references on the character mappers */
    G_cmap_from_fname->release_ref();
    G_cmap_to_fname->release_ref();
    G_cmap_from_ui->release_ref();
    G_cmap_to_ui->release_ref();
    G_cmap_from_file->release_ref();
    G_cmap_to_file->release_ref();
    G_cmap_to_log->release_ref();

    /* delete the saved UI character set name, if any */
    lib_free_str(G_disp_cset_name);

    /* delete the BigNumber register cache */
    CVmObjBigNum::term_cache();

    /* delete the TADS intrinsic function set's globals */
    delete G_bif_tads_globals;

    /* delete the predefined object table */
    VM_IF_ALLOC_PRE_GLOBAL(delete G_predef);

    /* delete the interpreter */
    VM_IFELSE_ALLOC_PRE_GLOBAL(delete G_interpreter,
                               G_interpreter->terminate());

    /* terminate the TadsObject class */
    CVmObjTads::class_term(vmg0_);

    /* delete the source file table */
    delete G_srcf_table;

    /* delete debugger objects */
    vm_terminate_debug_delete(vmg0_);

    /* delete dynamic compilation objects */
    if (G_dyncomp != 0)
    {
        delete G_dyncomp;
        G_dyncomp = 0;
    }

    /* delete the constant pools */
    VM_IFELSE_ALLOC_PRE_GLOBAL(delete G_code_pool,
                               G_code_pool->terminate());
    VM_IFELSE_ALLOC_PRE_GLOBAL(delete G_const_pool,
                               G_const_pool->terminate());

    /* 
     *   Clear the object table.  This deletes garbage-collected objects but
     *   doesn't delete the object table itself; we'll do that after we've
     *   cleared out the metaclass and function-set tables.  We need to
     *   remove the gc objects before the metaclasses and function tables
     *   because the gc objects sometimes depend on their metaclasses.  But
     *   the metaclasses and function sets sometimes keep VM globals, so we
     *   need to keep the object table around until after they're cleaned up.
     */
    G_obj_table->clear_obj_table(vmg0_);

    /* delete the dependency tables */
    G_bif_table->clear(vmg0_);
    delete G_meta_table;
    delete G_bif_table;

    /* delete the undo manager */
    delete G_undo;

    /* delete the object table */
    G_obj_table->delete_obj_table(vmg0_);
    VM_IF_ALLOC_PRE_GLOBAL(delete G_obj_table);

    /* delete the memory manager and heap manager */
    delete G_mem;
    delete G_varheap;

    /* delete the time zone cache */
    delete G_tzcache;

    /* delete the error context */
    err_terminate();

    /* delete the globals */
    vmglob_delete(vmg__);
}